

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  long lVar6;
  InstancePrimitive *prim;
  bool bVar7;
  AABBNodeMB4D *node1;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  Precalculations pre;
  NodeRef stack [244];
  Precalculations local_881;
  ulong *local_880;
  Ray *local_878;
  RayQueryContext *local_870;
  InstancePrimitive *local_868;
  long local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      local_880 = local_7d8 + 1;
      auVar15 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx((undefined1  [16])aVar5,auVar18);
      auVar35._8_4_ = 0x219392ef;
      auVar35._0_8_ = 0x219392ef219392ef;
      auVar35._12_4_ = 0x219392ef;
      auVar18 = vcmpps_avx(auVar18,auVar35,1);
      auVar18 = vblendvps_avx((undefined1  [16])aVar5,auVar35,auVar18);
      auVar35 = vrcpps_avx(auVar18);
      fVar29 = auVar35._0_4_;
      auVar22._0_4_ = fVar29 * auVar18._0_4_;
      fVar32 = auVar35._4_4_;
      auVar22._4_4_ = fVar32 * auVar18._4_4_;
      fVar33 = auVar35._8_4_;
      auVar22._8_4_ = fVar33 * auVar18._8_4_;
      fVar34 = auVar35._12_4_;
      auVar22._12_4_ = fVar34 * auVar18._12_4_;
      auVar36._8_4_ = 0x3f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar36._12_4_ = 0x3f800000;
      auVar18 = vsubps_avx(auVar36,auVar22);
      auVar23._0_4_ = fVar29 + fVar29 * auVar18._0_4_;
      auVar23._4_4_ = fVar32 + fVar32 * auVar18._4_4_;
      auVar23._8_4_ = fVar33 + fVar33 * auVar18._8_4_;
      auVar23._12_4_ = fVar34 + fVar34 * auVar18._12_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_808._4_4_ = uVar4;
      local_808._0_4_ = uVar4;
      local_808._8_4_ = uVar4;
      local_808._12_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_818._4_4_ = uVar4;
      local_818._0_4_ = uVar4;
      local_818._8_4_ = uVar4;
      local_818._12_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_828._4_4_ = uVar4;
      local_828._0_4_ = uVar4;
      local_828._8_4_ = uVar4;
      local_828._12_4_ = uVar4;
      local_838 = vshufps_avx(auVar23,auVar23,0);
      auVar18 = vmovshdup_avx(auVar23);
      local_848 = vshufps_avx(auVar23,auVar23,0x55);
      auVar35 = vshufpd_avx(auVar23,auVar23,1);
      uVar13 = (ulong)(auVar23._0_4_ < 0.0) * 0x10;
      local_858 = vshufps_avx(auVar23,auVar23,0xaa);
      uVar14 = (ulong)(auVar18._0_4_ < 0.0) << 4 | 0x20;
      auVar37 = ZEXT1664(local_808);
      auVar38 = ZEXT1664(local_818);
      auVar39 = ZEXT1664(local_828);
      auVar40 = ZEXT1664(local_838);
      auVar41 = ZEXT1664(local_848);
      auVar42 = ZEXT1664(local_858);
      uVar12 = (ulong)(auVar35._0_4_ < 0.0) << 4 | 0x40;
      local_7e8 = vshufps_avx(auVar15,auVar15,0);
      auVar43 = ZEXT1664(local_7e8);
      local_7f8 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar44 = ZEXT1664(local_7f8);
      local_878 = ray;
      local_870 = context;
LAB_00b861b9:
      if (local_880 != local_7d8) {
        uVar10 = local_880[-1];
        local_880 = local_880 + -1;
LAB_00b861d7:
        fVar3 = (ray->dir).field_0.m128[3];
        auVar15._4_4_ = fVar3;
        auVar15._0_4_ = fVar3;
        auVar15._8_4_ = fVar3;
        auVar15._12_4_ = fVar3;
        while ((uVar10 & 8) == 0) {
          uVar8 = uVar10 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar8 + 0x80 + uVar13);
          pfVar1 = (float *)(uVar8 + 0x20 + uVar13);
          auVar16._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar16._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar16._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar16._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar18 = vsubps_avx(auVar16,auVar37._0_16_);
          auVar17._0_4_ = auVar40._0_4_ * auVar18._0_4_;
          auVar17._4_4_ = auVar40._4_4_ * auVar18._4_4_;
          auVar17._8_4_ = auVar40._8_4_ * auVar18._8_4_;
          auVar17._12_4_ = auVar40._12_4_ * auVar18._12_4_;
          pfVar2 = (float *)(uVar8 + 0x80 + uVar14);
          auVar18 = vmaxps_avx(auVar43._0_16_,auVar17);
          pfVar1 = (float *)(uVar8 + 0x20 + uVar14);
          auVar19._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar19._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar19._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar19._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar35 = vsubps_avx(auVar19,auVar38._0_16_);
          pfVar2 = (float *)(uVar8 + 0x80 + uVar12);
          pfVar1 = (float *)(uVar8 + 0x20 + uVar12);
          auVar24._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar24._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar24._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar24._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar20._0_4_ = auVar41._0_4_ * auVar35._0_4_;
          auVar20._4_4_ = auVar41._4_4_ * auVar35._4_4_;
          auVar20._8_4_ = auVar41._8_4_ * auVar35._8_4_;
          auVar20._12_4_ = auVar41._12_4_ * auVar35._12_4_;
          auVar35 = vsubps_avx(auVar24,auVar39._0_16_);
          auVar25._0_4_ = auVar42._0_4_ * auVar35._0_4_;
          auVar25._4_4_ = auVar42._4_4_ * auVar35._4_4_;
          auVar25._8_4_ = auVar42._8_4_ * auVar35._8_4_;
          auVar25._12_4_ = auVar42._12_4_ * auVar35._12_4_;
          auVar35 = vmaxps_avx(auVar20,auVar25);
          pfVar2 = (float *)(uVar8 + 0x80 + (uVar13 ^ 0x10));
          pfVar1 = (float *)(uVar8 + 0x20 + (uVar13 ^ 0x10));
          auVar26._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar26._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar26._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar26._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar18 = vmaxps_avx(auVar18,auVar35);
          auVar35 = vsubps_avx(auVar26,auVar37._0_16_);
          auVar21._0_4_ = auVar40._0_4_ * auVar35._0_4_;
          auVar21._4_4_ = auVar40._4_4_ * auVar35._4_4_;
          auVar21._8_4_ = auVar40._8_4_ * auVar35._8_4_;
          auVar21._12_4_ = auVar40._12_4_ * auVar35._12_4_;
          auVar35 = vminps_avx(auVar44._0_16_,auVar21);
          pfVar2 = (float *)(uVar8 + 0x80 + (uVar14 ^ 0x10));
          pfVar1 = (float *)(uVar8 + 0x20 + (uVar14 ^ 0x10));
          auVar27._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar27._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar27._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar27._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar22 = vsubps_avx(auVar27,auVar38._0_16_);
          auVar28._0_4_ = auVar41._0_4_ * auVar22._0_4_;
          auVar28._4_4_ = auVar41._4_4_ * auVar22._4_4_;
          auVar28._8_4_ = auVar41._8_4_ * auVar22._8_4_;
          auVar28._12_4_ = auVar41._12_4_ * auVar22._12_4_;
          pfVar2 = (float *)(uVar8 + 0x80 + (uVar12 ^ 0x10));
          pfVar1 = (float *)(uVar8 + 0x20 + (uVar12 ^ 0x10));
          auVar30._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar30._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar30._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar30._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar22 = vsubps_avx(auVar30,auVar39._0_16_);
          auVar31._0_4_ = auVar42._0_4_ * auVar22._0_4_;
          auVar31._4_4_ = auVar42._4_4_ * auVar22._4_4_;
          auVar31._8_4_ = auVar42._8_4_ * auVar22._8_4_;
          auVar31._12_4_ = auVar42._12_4_ * auVar22._12_4_;
          auVar22 = vminps_avx(auVar28,auVar31);
          auVar35 = vminps_avx(auVar35,auVar22);
          auVar18 = vcmpps_avx(auVar18,auVar35,2);
          if (((uint)uVar10 & 7) == 6) {
            auVar35 = vcmpps_avx(*(undefined1 (*) [16])(uVar8 + 0xe0),auVar15,2);
            auVar22 = vcmpps_avx(auVar15,*(undefined1 (*) [16])(uVar8 + 0xf0),1);
            auVar35 = vandps_avx(auVar35,auVar22);
            auVar18 = vandps_avx(auVar35,auVar18);
          }
          auVar18 = vpslld_avx(auVar18,0x1f);
          uVar9 = vmovmskps_avx(auVar18);
          if (uVar9 == 0) goto LAB_00b861b9;
          uVar9 = uVar9 & 0xff;
          lVar6 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar8 + lVar6 * 8);
          uVar9 = uVar9 - 1 & uVar9;
          uVar11 = (ulong)uVar9;
          if (uVar9 != 0) goto LAB_00b86302;
        }
        local_868 = (InstancePrimitive *)(uVar10 & 0xfffffffffffffff0);
        local_860 = (ulong)((uint)uVar10 & 0xf) - 7;
        while( true ) {
          local_860 = local_860 + -1;
          if (local_860 == 0) break;
          prim = local_868;
          local_868 = local_868 + 1;
          bVar7 = InstanceIntersector1MB::occluded(&local_881,ray,local_870,prim);
          auVar44 = ZEXT1664(local_7f8);
          auVar43 = ZEXT1664(local_7e8);
          ray = local_878;
          if (bVar7) {
            local_878->tfar = -INFINITY;
            return;
          }
        }
        auVar37 = ZEXT1664(local_808);
        auVar38 = ZEXT1664(local_818);
        auVar39 = ZEXT1664(local_828);
        auVar40 = ZEXT1664(local_838);
        auVar41 = ZEXT1664(local_848);
        auVar42 = ZEXT1664(local_858);
        goto LAB_00b861b9;
      }
    }
  }
  return;
LAB_00b86302:
  do {
    *local_880 = uVar10;
    local_880 = local_880 + 1;
    lVar6 = 0;
    if (uVar11 != 0) {
      for (; (uVar11 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
      }
    }
    uVar10 = *(ulong *)(uVar8 + lVar6 * 8);
    uVar11 = uVar11 - 1 & uVar11;
  } while (uVar11 != 0);
  goto LAB_00b861d7;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }